

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

NodeRef * __thiscall
c4::yml::Tree::operator[](NodeRef *__return_storage_ptr__,Tree *this,csubstr key)

{
  code *pcVar1;
  Location LVar2;
  bool bVar3;
  size_t node;
  NodeRef *pNVar4;
  size_t sVar5;
  size_t sVar6;
  long lVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcVar10;
  byte bVar11;
  char msg [68];
  csubstr local_88;
  char local_78 [64];
  undefined4 local_38;
  
  sVar6 = key.len;
  pcVar8 = key.str;
  bVar11 = 0;
  node = root_id(this);
  local_88.str = pcVar8;
  local_88.len = sVar6;
  if (node == 0xffffffffffffffff) {
    pcVar9 = "check failed: (((ConstImpl const* __restrict__)this)->m_id != NONE)";
    pcVar10 = local_78;
    for (lVar7 = 8; lVar7 != 0; lVar7 = lVar7 + -1) {
      *(undefined8 *)pcVar10 = *(undefined8 *)pcVar9;
      pcVar9 = pcVar9 + ((ulong)bVar11 * -2 + 1) * 8;
      pcVar10 = pcVar10 + ((ulong)bVar11 * -2 + 1) * 8;
    }
    local_38 = 0x29454e;
    if ((s_error_flags & 1) != 0) {
      bVar3 = is_debugger_attached();
      if (bVar3) {
        pcVar1 = (code *)swi(3);
        pNVar4 = (NodeRef *)(*pcVar1)();
        return pNVar4;
      }
    }
    LVar2.super_LineCol.col = 0;
    LVar2.super_LineCol.offset = SUB168(ZEXT816(0x50b2) << 0x40,0);
    LVar2.super_LineCol.line = SUB168(ZEXT816(0x50b2) << 0x40,8);
    LVar2.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    LVar2.name.len = 0x65;
    (*(this->m_callbacks).m_error)(local_78,0x44,LVar2,(this->m_callbacks).m_user_data);
  }
  sVar5 = find_child(this,node,&local_88);
  __return_storage_ptr__->m_tree = this;
  if (sVar5 == 0xffffffffffffffff) {
    __return_storage_ptr__->m_id = node;
    (__return_storage_ptr__->m_seed).str = pcVar8;
    (__return_storage_ptr__->m_seed).len = sVar6;
  }
  else {
    __return_storage_ptr__->m_id = sVar5;
    (__return_storage_ptr__->m_seed).str = (char *)0x0;
    (__return_storage_ptr__->m_seed).len = 0;
    (__return_storage_ptr__->m_seed).len = 0xffffffffffffffff;
  }
  return __return_storage_ptr__;
}

Assistant:

NodeRef Tree::operator[] (csubstr key)
{
    return rootref()[key];
}